

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bezier.cpp
# Opt level: O2

int __thiscall Bezier::init(Bezier *this,EVP_PKEY_CTX *ctx)

{
  Vector3 *this_00;
  Polynomial *this_01;
  Polynomial *this_02;
  pointer pVVar1;
  double dVar2;
  int extraout_EAX;
  ostream *poVar3;
  Vector3 *i;
  pointer A;
  float fVar4;
  float fVar5;
  double dVar6;
  Vector3 local_a0;
  pair<Polynomial,_Polynomial> tmp;
  Vector3 local_58;
  Vector3 local_38;
  
  puts("initializing Bezier");
  this_00 = &this->Dz;
  Vector3::normalized(this_00);
  (this->Dz).z = (double)tmp.first.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
  (this->Dz).x = (double)tmp.first.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
  (this->Dz).y = (double)tmp.first.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish;
  dVar6 = (this->Dz).x;
  if ((((dVar6 < -1e-05) || (1e-05 < dVar6)) || (dVar6 = (this->Dz).y + -1.0, dVar6 < -1e-05)) ||
     (((1e-05 < dVar6 || (dVar6 = (this->Dz).z, dVar6 < -1e-05)) || (1e-05 < dVar6)))) {
    local_58.x._0_4_ = 0;
    local_58.x._4_4_ = 0;
    local_58.y._0_4_ = 0;
    local_58.y._4_4_ = 0x3ff00000;
    local_58.z = 0.0;
    Vector3::cross(&local_58,this_00);
    Vector3::normalized(&local_a0);
    (this->Dx).z = (double)tmp.first.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
    (this->Dx).x = (double)tmp.first.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
    (this->Dx).y = (double)tmp.first.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish;
  }
  else {
    (this->Dx).x = 1.0;
    (this->Dx).y = 0.0;
    (this->Dx).z = 0.0;
  }
  Vector3::cross(this_00,&this->Dx);
  (this->Dy).z = (double)tmp.first.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
  (this->Dy).x = (double)tmp.first.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
  (this->Dy).y = (double)tmp.first.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish;
  pVVar1 = (this->control_points).super__Vector_base<Vector3,_std::allocator<Vector3>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (A = (this->control_points).super__Vector_base<Vector3,_std::allocator<Vector3>_>._M_impl.
           super__Vector_impl_data._M_start; A != pVVar1; A = A + 1) {
    operator/=(A,&this->S);
  }
  P2d(&tmp,this,0,
      (int)(((long)(this->control_points).super__Vector_base<Vector3,_std::allocator<Vector3>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->control_points).super__Vector_base<Vector3,_std::allocator<Vector3>_>.
                  _M_impl.super__Vector_impl_data._M_start) / 0x18));
  this_01 = &this->px;
  std::vector<double,_std::allocator<double>_>::operator=
            (&this_01->c,(vector<double,_std::allocator<double>_> *)&tmp);
  this_02 = &this->py;
  std::vector<double,_std::allocator<double>_>::operator=(&this_02->c,&tmp.second.c);
  Polynomial::derivative((Polynomial *)&local_a0,this_01);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&(this->dpx).c,&local_a0);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&local_a0);
  Polynomial::derivative((Polynomial *)&local_a0,this_02);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&(this->dpy).c,&local_a0);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&local_a0);
  dVar6 = Polynomial::operator()(this_01,0.0);
  dVar2 = Polynomial::operator()(this_02,0.0);
  printf("Test for Bezier: P(%.3f)=(%.3f, %.3f)\n",0,dVar6,dVar2);
  dVar6 = Polynomial::operator()(this_01,0.5);
  dVar2 = Polynomial::operator()(this_02,0.5);
  printf("Test for Bezier: P(%.3f)=(%.3f, %.3f)\n",0,dVar6,dVar2);
  dVar6 = Polynomial::operator()(this_01,1.0);
  dVar2 = Polynomial::operator()(this_02,1.0);
  printf("Test for Bezier: P(%.3f)=(%.3f, %.3f)\n",0,dVar6,dVar2);
  std::operator<<((ostream *)&std::cout,"Bezier points:\n");
  for (fVar4 = 0.0; fVar4 <= 1.0; fVar4 = fVar4 + 0.01) {
    for (fVar5 = 0.0; fVar5 <= 1.0; fVar5 = fVar5 + 0.01) {
      getPoint(&local_38,this,(double)fVar4,(double)(fVar5 + fVar5) * ::PI);
      BoundingBox::include(&this->bbox,&local_38);
    }
  }
  poVar3 = operator<<((ostream *)&std::cout,&this->bbox);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::pair<Polynomial,_Polynomial>::~pair(&tmp);
  return extraout_EAX;
}

Assistant:

void Bezier::init()
{
    printf("initializing Bezier\n");
    Dz = Dz.normalized();
    if (!sign(Dz.x) && !sign(Dz.y - 1) && !sign(Dz.z)) Dx = Vector3(1, 0, 0);
    else Dx = Vector3(0, 1, 0).cross(Dz).normalized();
    Dy = Dz.cross(Dx);
    for (auto &i :control_points) i /= S;
    std::pair<Polynomial, Polynomial> tmp = P2d(0, control_points.size());
    px = tmp.first; py = tmp.second;
    dpx = px.derivative(); dpy = py.derivative();
    printf("Test for Bezier: P(%.3f)=(%.3f, %.3f)\n", 0., px(0), py(0));
    printf("Test for Bezier: P(%.3f)=(%.3f, %.3f)\n", 0.5, px(0.5), py(0.5));
    printf("Test for Bezier: P(%.3f)=(%.3f, %.3f)\n", 1., px(1), py(1));
    std::cout << "Bezier points:\n";
    for (float u = 0.0f, i = 0, du = 0.01; u <= 1.0f; u += du, i++) {
        for (float v = 0.0f, j = 0, dv = 0.01; v <= 1.0f; v += dv, j++) {
            bbox.include(getPoint(u, v * 2 * PI));
        }
    }
    std::cout << bbox << std::endl;
}